

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O0

int wasm_random_digit(char *digitPtr)

{
  byte bVar1;
  time_t tVar2;
  long in_RDI;
  bool bVar3;
  ifstream fin;
  streamoff in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined8 local_238;
  undefined8 local_230;
  long local_218 [65];
  long local_10;
  uint local_4;
  
  local_10 = in_RDI;
  std::ifstream::ifstream(local_218,"t10k-images-idx3-ubyte",_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  bVar3 = (bVar1 & 1) != 0;
  if (bVar3) {
    fprintf(_stderr,"failed to open digits file\n");
  }
  else {
    tVar2 = time((time_t *)0x0);
    srand((uint)tVar2);
    rand();
    std::fpos<__mbstate_t>::fpos
              ((fpos<__mbstate_t> *)CONCAT17(bVar1,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdb8);
    std::istream::seekg(local_218,local_238,local_230);
    std::istream::read((char *)local_218,local_10);
  }
  local_4 = (uint)!bVar3;
  std::ifstream::~ifstream(local_218);
  return local_4;
}

Assistant:

int wasm_random_digit(char * digitPtr) {
    auto fin = std::ifstream("t10k-images-idx3-ubyte", std::ios::binary);
    if (!fin) {
        fprintf(stderr, "failed to open digits file\n");
        return 0;
    }
    srand(time(NULL));

    // Seek to a random digit: 16-byte header + 28*28 * (random 0 - 10000)
    fin.seekg(16 + MNIST_NINPUT * (rand() % MNIST_NTEST));
    fin.read(digitPtr, MNIST_NINPUT);

    return 1;
}